

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<SuperClass>::moveAppend
          (QGenericArrayOps<SuperClass> *this,SuperClass *b,SuperClass *e)

{
  SuperClass *pSVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<SuperClass>).ptr;
    qVar5 = (this->super_QArrayDataPointer<SuperClass>).size;
    do {
      pDVar2 = (b->classname).d.d;
      (b->classname).d.d = (Data *)0x0;
      pSVar1[qVar5].classname.d.d = pDVar2;
      pcVar3 = (b->classname).d.ptr;
      (b->classname).d.ptr = (char *)0x0;
      pSVar1[qVar5].classname.d.ptr = pcVar3;
      qVar4 = (b->classname).d.size;
      (b->classname).d.size = 0;
      pSVar1[qVar5].classname.d.size = qVar4;
      pDVar2 = (b->qualified).d.d;
      (b->qualified).d.d = (Data *)0x0;
      pSVar1[qVar5].qualified.d.d = pDVar2;
      pcVar3 = (b->qualified).d.ptr;
      (b->qualified).d.ptr = (char *)0x0;
      pSVar1[qVar5].qualified.d.ptr = pcVar3;
      qVar4 = (b->qualified).d.size;
      (b->qualified).d.size = 0;
      pSVar1[qVar5].qualified.d.size = qVar4;
      pSVar1[qVar5].access = b->access;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<SuperClass>).size + 1;
      (this->super_QArrayDataPointer<SuperClass>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }